

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

u_char * ngx_strnstr(u_char *s1,char *s2,size_t len)

{
  char cVar1;
  int iVar2;
  size_t __n;
  ulong uVar3;
  u_char *__s1;
  size_t n;
  u_char c2;
  ulong uStack_28;
  u_char c1;
  size_t len_local;
  char *s2_local;
  u_char *s1_local;
  
  cVar1 = *s2;
  __n = strlen(s2 + 1);
  uStack_28 = len;
  __s1 = s1;
  do {
    do {
      s2_local = (char *)__s1;
      uVar3 = uStack_28 - 1;
      if (uStack_28 == 0) {
        return (u_char *)0x0;
      }
      __s1 = (u_char *)(s2_local + 1);
      if (*s2_local == '\0') {
        return (u_char *)0x0;
      }
      uStack_28 = uVar3;
    } while (*s2_local != cVar1);
    if (uVar3 < __n) {
      return (u_char *)0x0;
    }
    iVar2 = strncmp((char *)__s1,s2 + 1,__n);
  } while (iVar2 != 0);
  return (u_char *)s2_local;
}

Assistant:

u_char *
ngx_strnstr(u_char *s1, char *s2, size_t len)
{
    u_char  c1, c2;
    size_t  n;

    c2 = *(u_char *) s2++;

    n = ngx_strlen(s2);

    do {
        do {
            if (len-- == 0) {
                return NULL;
            }

            c1 = *s1++;

            if (c1 == 0) {
                return NULL;
            }

        } while (c1 != c2);

        if (n > len) {
            return NULL;
        }

    } while (ngx_strncmp(s1, (u_char *) s2, n) != 0);

    return --s1;
}